

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::add_abs_fixup(CTcDataStream *this,CTcAbsFixup **list_head)

{
  CTcAbsFixup **in_RSI;
  CTcDataStream *in_RDI;
  CTcAbsFixup **list_head_00;
  
  list_head_00 = in_RSI;
  get_ofs(in_RDI);
  CTcAbsFixup::add_abs_fixup(list_head_00,in_RDI,(ulong)in_RSI);
  return;
}

Assistant:

void CTcDataStream::add_abs_fixup(CTcAbsFixup **list_head)
{
    /* add the fixup to the list at my current write location */
    CTcAbsFixup::add_abs_fixup(list_head, this, get_ofs());
}